

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_struct_ostream_operator
          (t_cpp_generator *this,ostream *out,t_struct *tstruct)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  string local_60;
  string local_40;
  
  bVar1 = has_custom_ostream(this,&tstruct->super_t_type);
  if (!bVar1) {
    poVar3 = std::operator<<(out,"std::ostream& operator<<(std::ostream& out, const ");
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
    poVar3 = std::operator<<(poVar3,"& obj)");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_up(&this->super_t_oop_generator,out);
    t_generator::indent_abi_cxx11_(&local_40,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_40);
    poVar3 = std::operator<<(poVar3,"obj.printTo(out);");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_60,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_60);
    poVar3 = std::operator<<(poVar3,"return out;");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_struct_ostream_operator(std::ostream& out, t_struct* tstruct) {
  if (!has_custom_ostream(tstruct)) {
    // thrift defines this behavior
    out << "std::ostream& operator<<(std::ostream& out, const "
        << tstruct->get_name()
        << "& obj)" << endl;
    scope_up(out);
    out << indent() << "obj.printTo(out);" << endl
        << indent() << "return out;" << endl;
    scope_down(out);
    out << endl;
  }
}